

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O3

int segdmp_open_write(char **dirs,char *dfn,char *ifn,uint32 n,uint32 *in_n_seg,uint32 **in_n_frame,
                     segdmp_type_t data_type,uint32 i_n_stream,uint32 *i_vecsize,uint32 i_blksize)

{
  uint uVar1;
  uint32 *puVar2;
  uint32 *puVar3;
  uint32 *puVar4;
  uint32 **ppuVar5;
  uint32 *puVar6;
  uint32 *puVar7;
  segdmp_type_t sVar8;
  int32 iVar9;
  cmd_ln_t *cmdln;
  FILE *__stream;
  FILE *fp;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  uint32 uVar13;
  ulong uVar14;
  uint32 uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  uint32 onefrm;
  uint32 local_4c;
  int local_48;
  uint local_44;
  char *local_40;
  char *local_38;
  
  sVar8 = data_type;
  n_stream = i_n_stream;
  vecsize = i_vecsize;
  blksize = i_blksize;
  n_seg = in_n_seg;
  n_frame = in_n_frame;
  local_38 = dfn;
  printf("dfn is %s\n");
  local_40 = ifn;
  printf("ifn is %s\n",ifn);
  fflush(_stdout);
  uVar17 = 0xffffffff;
  do {
    uVar16 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar16;
  } while (dirs[uVar17] != (char *)0x0);
  cur_type = sVar8;
  if (sVar8 == SEGDMP_TYPE_VQ) {
    pcVar10 = "Producing VQ dump\n";
    lVar11 = 0x1db;
LAB_0010905b:
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
            ,lVar11,pcVar10);
  }
  else {
    if (sVar8 == SEGDMP_TYPE_MFCC) {
      pcVar10 = "Producing MFCC dump\n";
      lVar11 = 0x1d8;
      goto LAB_0010905b;
    }
    if (sVar8 == SEGDMP_TYPE_FEAT) {
      pcVar10 = "Producing FEAT dump\n";
      lVar11 = 0x1d5;
      goto LAB_0010905b;
    }
  }
  if (n == 0) {
    sVar12 = 0;
    uVar18 = 0;
  }
  else {
    sVar12 = (size_t)n;
    uVar17 = 0;
    uVar18 = 0;
    do {
      uVar1 = n_seg[uVar17];
      if (n_frame == (uint32 **)0x0) {
        uVar18 = uVar1 + uVar18;
      }
      else if ((ulong)uVar1 != 0) {
        uVar14 = 0;
        do {
          uVar18 = uVar18 + n_frame[uVar17][uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar1 != uVar14);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != sVar12);
  }
  n_id = n;
  id_part = (uint32 *)
            __ckd_calloc__(sVar12,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x1ec);
  id_off = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1ed);
  id_len = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1ee);
  if (cur_type == SEGDMP_TYPE_VQ) {
    frame_sz = 4;
  }
  else {
    if (cur_type == SEGDMP_TYPE_MFCC) {
      cmdln = cmd_ln_get();
      lVar11 = cmd_ln_int_r(cmdln,"-ceplen");
      uVar13 = (uint32)lVar11;
    }
    else {
      uVar13 = blksize;
      if (cur_type != SEGDMP_TYPE_FEAT) goto LAB_00109170;
    }
    frame_sz = uVar13 << 2;
  }
LAB_00109170:
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x205,"%u total frames; %u frames/dmp max\n",(ulong)uVar18);
  puVar6 = id_part;
  *id_part = 0;
  puVar4 = id_off;
  *id_off = 0;
  puVar7 = id_len;
  ppuVar5 = n_frame;
  puVar3 = n_seg;
  uVar13 = *n_seg;
  if (n_frame == (uint32 **)0x0) {
    *id_len = uVar13;
  }
  else if (uVar13 == 0) {
    uVar13 = *id_len;
  }
  else {
    puVar2 = *n_frame;
    uVar13 = *id_len;
    uVar17 = 0;
    do {
      uVar13 = uVar13 + puVar2[uVar17];
      *puVar7 = uVar13;
      uVar17 = uVar17 + 1;
    } while (uVar17 < *puVar3);
  }
  uVar17 = (ulong)(uVar13 * frame_sz);
  if (uVar13 * frame_sz < 0x7f000001) {
    uVar17 = 1;
    if (1 < n_id) {
      uVar17 = 1;
      uVar13 = 0;
      do {
        uVar15 = frame_sz * puVar7[uVar17 - 1] + puVar4[uVar17 - 1];
        bVar20 = uVar15 < 0x7f000001;
        if (!bVar20) {
          uVar15 = 0;
        }
        uVar13 = (uVar13 + 1) - (uint)bVar20;
        puVar4[uVar17] = uVar15;
        puVar6[uVar17] = uVar13;
        if (ppuVar5 == (uint32 **)0x0) {
          puVar7[uVar17] = puVar3[uVar17];
        }
        else if (puVar3[uVar17] != 0) {
          puVar2 = ppuVar5[uVar17];
          uVar15 = puVar7[uVar17];
          uVar14 = 0;
          do {
            uVar15 = uVar15 + puVar2[uVar14];
            puVar7[uVar17] = uVar15;
            uVar14 = uVar14 + 1;
          } while (uVar14 < puVar3[uVar17]);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < n_id);
      uVar17 = (ulong)(uVar13 + 1);
    }
    n_part = (uint32)uVar17;
    if (n_part <= uVar16) {
      sVar12 = 0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
              ,0x233,"%u of %u directories filled\n",uVar17,(ulong)uVar16);
      dmp_fp = (FILE **)__ckd_calloc__((ulong)n_part,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                       ,0x23b);
      if (n_part != 0) {
        uVar17 = 0;
        do {
          sprintf(dmp_fn,"%s/%s",dirs[uVar17],local_38);
          __stream = (FILE *)s3open(dmp_fn,"wb",(uint32 *)0x0);
          dmp_fp[uVar17] = (FILE *)__stream;
          lVar11 = ftell(__stream);
          puVar4 = id_part;
          puVar3 = id_off;
          if (n_id != 0) {
            uVar14 = 0;
            uVar13 = n_id;
            do {
              if (uVar17 == puVar4[uVar14]) {
                puVar3[uVar14] = puVar3[uVar14] + (int)lVar11;
                uVar13 = n_id;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < uVar13);
          }
          uVar17 = uVar17 + 1;
          sVar12 = (size_t)n_part;
        } while (uVar17 < sVar12);
      }
      idx_fp = (FILE **)__ckd_calloc__(sVar12,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                       ,0x249);
      if (local_40 == (char *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                ,0x25f,"Assuming prior indices are available and appropriate\n");
      }
      else if (n_part != 0) {
        uVar17 = 0;
        pcVar10 = local_40;
        do {
          sprintf(idx_fn,"%s/%s",dirs[uVar17],pcVar10);
          fp = s3open(idx_fn,"wb",(uint32 *)0x0);
          idx_fp[uVar17] = fp;
          iVar9 = bio_fwrite(&data_type,4,1,fp,0,&ignore);
          if (iVar9 != 1) {
            pcVar10 = "unable to write seg dmp file";
            lVar11 = 0x252;
LAB_00109838:
            err_msg_system(ERR_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,lVar11,pcVar10);
            goto LAB_00109844;
          }
          iVar9 = bio_fwrite(&n_id,4,1,idx_fp[uVar17],0,&ignore);
          if (iVar9 != 1) {
            pcVar10 = "Unable to write index file";
            lVar11 = 299;
            goto LAB_00109838;
          }
          local_44 = (uint)(n_frame == (uint32 **)0x0);
          iVar9 = bio_fwrite(&local_44,4,1,idx_fp[uVar17],0,&ignore);
          if (iVar9 != 1) {
            pcVar10 = "Unable to write index file";
            lVar11 = 0x137;
            goto LAB_00109838;
          }
          iVar9 = bio_fwrite(&frame_sz,4,1,idx_fp[uVar17],0,&ignore);
          if (iVar9 != 1) {
            pcVar10 = "Unable to write index file";
            lVar11 = 0x13d;
            goto LAB_00109838;
          }
          if ((ulong)n_id == 0) {
            uVar14 = 0;
LAB_00109510:
            local_48 = 0;
            local_4c = (uint32)uVar14;
            if (local_4c < n_id) {
              lVar11 = 0;
              do {
                if (uVar17 != id_part[(uVar14 & 0xffffffff) + lVar11]) break;
                lVar11 = lVar11 + 1;
                local_48 = (int)lVar11;
              } while (n_id - local_4c != local_48);
            }
          }
          else {
            uVar14 = 0;
            do {
              if (uVar17 == id_part[uVar14]) goto LAB_00109510;
              uVar14 = uVar14 + 1;
            } while (n_id != uVar14);
            local_48 = 0;
            local_4c = n_id;
          }
          iVar9 = bio_fwrite(&local_4c,4,1,idx_fp[uVar17],0,&ignore);
          if (iVar9 != 1) {
            pcVar10 = "Unable to write index file";
            lVar11 = 0x14d;
            goto LAB_00109838;
          }
          iVar9 = bio_fwrite(&local_48,4,1,idx_fp[uVar17],0,&ignore);
          if (iVar9 != 1) {
            pcVar10 = "Unable to write index file";
            lVar11 = 0x152;
            goto LAB_00109838;
          }
          while ((pcVar10 = local_40, local_4c < n_id && (uVar17 == id_part[local_4c]))) {
            iVar9 = bio_fwrite(n_seg + local_4c,4,1,idx_fp[uVar17],0,&ignore);
            if (iVar9 != 1) {
              pcVar10 = "Unable to write index file";
              lVar11 = 0x159;
              goto LAB_00109838;
            }
            iVar9 = bio_fwrite(id_off + local_4c,4,1,idx_fp[uVar17],0,&ignore);
            if (iVar9 != 1) {
              pcVar10 = "Unable to write index file";
              lVar11 = 0x15e;
              goto LAB_00109838;
            }
            uVar14 = (ulong)local_4c;
            if ((local_44 == 0) && (n_seg[uVar14] != 0)) {
              lVar11 = 0;
              uVar19 = 0;
              do {
                iVar9 = bio_fwrite((void *)((long)n_frame[uVar14] + lVar11),4,1,idx_fp[uVar17],0,
                                   &ignore);
                if (iVar9 != 1) {
                  pcVar10 = "Unable to write index file";
                  lVar11 = 0x165;
                  goto LAB_00109838;
                }
                uVar19 = uVar19 + 1;
                uVar14 = (ulong)local_4c;
                lVar11 = lVar11 + 4;
              } while (uVar19 < n_seg[uVar14]);
            }
            local_4c = local_4c + 1;
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                  ,0x255,"Created index %s/%s\n",dirs[uVar17],local_40);
          s3close(idx_fp[uVar17]);
          uVar17 = uVar17 + 1;
        } while (uVar17 < n_part);
      }
      ckd_free(idx_fp);
      idx_fp = (FILE **)0x0;
      alloc_frm_buf = frm_buf_sz / frame_sz;
      printf("frm_buf_size is %d frame_sz is %d\n",(ulong)frm_buf_sz,(ulong)frame_sz);
      fflush(_stdout);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
              ,0x269,"%u frames buffered before write\n",(ulong)alloc_frm_buf);
      alloc_frm_buf = alloc_frm_buf * frame_sz;
      frm_buf = (char *)__ckd_calloc__((ulong)alloc_frm_buf,1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                       ,0x26c);
      if (frm_buf != (char *)0x0) {
        h_seg = (seg_t **)
                __ckd_calloc__((ulong)n_id,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0x270);
        t_seg = (seg_t **)
                __ckd_calloc__((ulong)n_id,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0x271);
        cur_type = data_type;
        return 0;
      }
      puts("died like a pig");
      goto LAB_00109844;
    }
    pcVar10 = "%u directories required, but only %u given\n";
    lVar11 = 0x237;
    uVar14 = (ulong)uVar16;
  }
  else {
    pcVar10 = "ID 0 has more data (%u bytes) than DMP_MAX (%u bytes); Increase DMP_MAX\n";
    lVar11 = 0x214;
    uVar14 = 0x7f000000;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,lVar11,pcVar10,uVar17,uVar14);
LAB_00109844:
  exit(1);
}

Assistant:

int
segdmp_open_write(const char **dirs,		/* directories available for dump files */
		  const char *dfn,		/* dump file name */
		  const char *ifn,		/* index file name */
		  uint32 n,			/* # of segment id's (i.e. phones, states, etc.)*/
		  uint32 *in_n_seg,		/* # of segments per id */
		  uint32 **in_n_frame,		/* length of each segment in # of frames */
		  segdmp_type_t data_type,	/* type of data to store in segment dump */
		  uint32 i_n_stream,
		  uint32* i_vecsize,
		  uint32 i_blksize)
{
    uint32 n_dmp_min;
    uint32 n_dmp_frame_max;
    uint32 n_dir;
    uint32 n_tot_frame;
    uint32 i, j;
    uint32 part = 0;
    uint32 hdr_sz;
    
    n_seg = in_n_seg;
    n_frame = in_n_frame;	/* NULL => 1 frame per segment */

    n_stream = i_n_stream;
    vecsize = i_vecsize;
    blksize = i_blksize;

    printf("dfn is %s\n", dfn);
    printf("ifn is %s\n", ifn);
    fflush(stdout);

    for (n_dir = 0; dirs[n_dir]; n_dir++);

    cur_type = data_type;

    if (cur_type == SEGDMP_TYPE_FEAT) {
	E_INFO("Producing FEAT dump\n");
    }
    else if (cur_type == SEGDMP_TYPE_MFCC) {
	E_INFO("Producing MFCC dump\n");
    }
    else if (cur_type == SEGDMP_TYPE_VQ) {
	E_INFO("Producing VQ dump\n");
    }

    for (n_tot_frame = 0, i = 0; i < n; i++) {
	if (n_frame == NULL) {
	    /* one frame segments, so n_seg == n_frame */
	    n_tot_frame += n_seg[i];
	}
	else {
	    for (j = 0; j < n_seg[i]; j++) {
		n_tot_frame += n_frame[i][j];
	    }
	}
    }

    n_id = n;

    id_part = ckd_calloc(n_id, sizeof(uint32));
    id_off = ckd_calloc(n_id, sizeof(uint32));
    id_len = ckd_calloc(n_id, sizeof(uint32));
    
    if (cur_type == SEGDMP_TYPE_FEAT) {
	frame_sz = blksize * sizeof(float32);
    }
    else if (cur_type == SEGDMP_TYPE_VQ) {
	frame_sz = 4;	/* HAQUE */
    }
    else if (cur_type == SEGDMP_TYPE_MFCC) {
	/* Ideally, this module shouldn't be calling cmd_ln_* functions */
	frame_sz = cmd_ln_int32("-ceplen") * sizeof(float32);
    }

    n_dmp_frame_max = (DMP_MAX / frame_sz);
    
    if (DMP_MAX % frame_sz)
	++n_dmp_frame_max;
    
    n_dmp_min = n_tot_frame / n_dmp_frame_max;

    if (n_tot_frame % n_dmp_frame_max)
	++n_dmp_min;
    
    E_INFO("%u total frames; %u frames/dmp max\n", n_tot_frame, n_dmp_frame_max);

    part = 0;
    id_part[0] = part;
    id_off[0] = 0;
    if (n_frame == NULL) {
	id_len[0] = n_seg[0];
    }
    else {
	for (j = 0; j < n_seg[0]; j++) {
	    id_len[0] += n_frame[0][j];
	}
    }

    if (id_len[0] * frame_sz > DMP_MAX) {
	E_FATAL("ID 0 has more data (%u bytes) than DMP_MAX (%u bytes); Increase DMP_MAX\n", id_len[0]*frame_sz, DMP_MAX);
    }

    /* compute dump part, offset and len for all remaining id's */
    for (i = 1; i < n_id; i++) {
	id_off[i] = id_off[i-1] + id_len[i-1] * frame_sz;

	if (id_off[i] > DMP_MAX) {
	    ++part;
	    id_off[i] = 0;
	}

	id_part[i] = part;

	if (n_frame == NULL) {
	    /* i.e. 1 frame per segment */
	    id_len[i] = n_seg[i];
	}
	else {
	    for (j = 0; j < n_seg[i]; j++) {
		id_len[i] += n_frame[i][j];
	    }
	}
    }

    ++part;

    n_part = part;

    if (n_part <= n_dir) {
	E_INFO("%u of %u directories filled\n",
	       n_part, n_dir);
    }
    else {
	E_FATAL("%u directories required, but only %u given\n",
		n_part, n_dir);
    }

    /* Create/open the dump files */
    dmp_fp = ckd_calloc(n_part, sizeof(FILE *));
    for (i = 0; i < n_part; i++) {
	sprintf(dmp_fn, "%s/%s", dirs[i], dfn);

	dmp_fp[i] = s3open(dmp_fn, "wb", NULL);

	/* add the file header size to all the offsets computed above. */
	hdr_sz = ftell(dmp_fp[i]);
	for (j = 0; j < n_id; j++) {
	    if (id_part[j] == i)
		id_off[j] += hdr_sz;
	}
    }

    idx_fp = ckd_calloc(n_part, sizeof(FILE *));
    if (ifn) {
	for (i = 0; i < n_part; i++) {
	    /* Create the index file */
	    sprintf(idx_fn, "%s/%s", dirs[i], ifn);
	    
	    idx_fp[i] = s3open(idx_fn, "wb", NULL);
	    
	    if (bio_fwrite((int *)&data_type, sizeof(int), 1, idx_fp[i], 0, &ignore) != 1) {
		E_FATAL_SYSTEM("unable to write seg dmp file");
	    }
	    if (write_idx(i) == S3_SUCCESS) {
		E_INFO("Created index %s/%s\n", dirs[i], ifn);
	    }
	    else {
		E_INFO("Error creating index %s/%s\n", dirs[i], ifn);
	    }
		
	    s3close(idx_fp[i]);
	}
    }
    else {
	E_INFO("Assuming prior indices are available and appropriate\n");
    }

    ckd_free((void *)idx_fp);
    idx_fp = NULL;

    alloc_frm_buf = frm_buf_sz / frame_sz;
    printf("frm_buf_size is %d frame_sz is %d\n", frm_buf_sz , frame_sz);
    fflush(stdout);

    E_INFO("%u frames buffered before write\n", alloc_frm_buf);
    alloc_frm_buf *= frame_sz;			/* make a multiple of frame_sz */

    if ((frm_buf = (void *)ckd_calloc(alloc_frm_buf, sizeof(char)) )==NULL) {
	printf("died like a pig\n");
	exit(1);
    }
    h_seg = (seg_t **)ckd_calloc(n_id, sizeof(seg_t *));
    t_seg = (seg_t **)ckd_calloc(n_id, sizeof(seg_t *));

    cur_type = data_type;
    
    return S3_SUCCESS;
}